

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::QueuedClient::QueuedClient
          (QueuedClient *this,Promise<kj::Own<capnp::ClientHook>_> *promiseParam)

{
  ForkedPromise<kj::Own<capnp::ClientHook>_> local_78;
  ForkedPromise<kj::Own<capnp::ClientHook>_> local_68;
  QueuedClient *local_58;
  Type local_50;
  ForkedPromise<kj::Own<capnp::ClientHook>_> local_48;
  Promise<void> local_38 [2];
  Promise<kj::Own<capnp::ClientHook>_> *local_18;
  Promise<kj::Own<capnp::ClientHook>_> *promiseParam_local;
  QueuedClient *this_local;
  
  local_18 = promiseParam;
  promiseParam_local = (Promise<kj::Own<capnp::ClientHook>_> *)this;
  ClientHook::ClientHook(&this->super_ClientHook);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_005cf598;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_005cf5f0;
  kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe(&this->redirect);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promise);
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch(&local_48);
  local_58 = this;
  local_50.this = this;
  kj::Promise<kj::Own<capnp::ClientHook>>::
  then<capnp::QueuedClient::QueuedClient(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Own<capnp::ClientHook>&&)_1_,capnp::QueuedClient::QueuedClient(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::Own<capnp::ClientHook>> *)local_38,(Type *)&local_48,&local_50);
  kj::Promise<void>::eagerlyEvaluate(&this->selfResolutionOp,local_38);
  kj::Promise<void>::~Promise(local_38);
  kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
            ((Promise<kj::Own<capnp::ClientHook>_> *)&local_48);
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch(&local_68);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promiseForCallForwarding);
  kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
            ((Promise<kj::Own<capnp::ClientHook>_> *)&local_68);
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch(&local_78);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promiseForClientResolution);
  kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
            ((Promise<kj::Own<capnp::ClientHook>_> *)&local_78);
  return;
}

Assistant:

QueuedClient(kj::Promise<kj::Own<ClientHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<ClientHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenCap(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)),
        promiseForCallForwarding(promise.addBranch().fork()),
        promiseForClientResolution(promise.addBranch().fork()) {}